

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

void PDHG_Compute_Primal_Feasibility
               (CUPDLPwork *work,cupdlp_float *primalResidual,cupdlp_float *ax,cupdlp_float *x,
               cupdlp_float *dPrimalFeasibility,cupdlp_float *dPrimalObj)

{
  undefined8 *puVar1;
  void *in_RDX;
  void *in_RSI;
  long *in_RDI;
  ulong *in_R8;
  double *in_R9;
  cupdlp_int index;
  cupdlp_float alpha;
  CUPDLPscaling *scaling;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  cupdlp_float *in_stack_ffffffffffffffb0;
  cupdlp_float *x_00;
  int *piVar2;
  cupdlp_int n;
  CUPDLPwork *w;
  
  puVar1 = (undefined8 *)*in_RDI;
  w = (CUPDLPwork *)*puVar1;
  piVar2 = (int *)in_RDI[5];
  cupdlp_dot(w,(cupdlp_int)((ulong)piVar2 >> 0x20),in_stack_ffffffffffffffb0,
             (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (cupdlp_float *)0x7fd7df);
  *in_R9 = *in_R9 * (double)puVar1[0xd] + (double)puVar1[0xc];
  memcpy(in_RSI,in_RDX,(long)*(int *)&w->problem << 3);
  x_00 = (cupdlp_float *)0xbff0000000000000;
  cupdlp_axpy(w,(cupdlp_int)((ulong)piVar2 >> 0x20),(cupdlp_float *)0xbff0000000000000,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
              (cupdlp_float *)0x7fd85a);
  cupdlp_projNeg(x_00,in_stack_ffffffffffffffac);
  if (*piVar2 != 0) {
    cupdlp_edot(x_00,(cupdlp_float *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0
               );
  }
  n = (cupdlp_int)((ulong)piVar2 >> 0x20);
  if (*(int *)(in_RDI[1] + 0x28) == 0) {
    cupdlp_twoNorm(w,n,x_00,(cupdlp_float *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    cupdlp_infNormIndex(w,n,x_00,(cupdlp_int *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *in_R8 = *(ulong *)((long)in_RSI + (long)in_stack_ffffffffffffffac * 8) & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void PDHG_Compute_Primal_Feasibility(CUPDLPwork *work, cupdlp_float *primalResidual,
                                    const cupdlp_float *ax, const cupdlp_float *x,
                                    cupdlp_float *dPrimalFeasibility,
                                    cupdlp_float *dPrimalObj) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPscaling *scaling = work->scaling;

  // primal variable violation

  // todo, add this
  //    *dPrimalObj = Dotprod_Neumaier(problem->cost, x, lp->nCols);
  cupdlp_dot(work, lp->nCols, x, problem->cost, dPrimalObj);
  *dPrimalObj = *dPrimalObj * problem->sense_origin + problem->offset;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  primalResidual = work->buffer2;

  cupdlp_primal_feasibility_kernel_cuda(primalResidual, ax, problem->rhs,
                                        work->rowScale, scaling->ifScaled,
                                        problem->nEqs, lp->nRows);

  cupdlp_twoNorm(work, lp->nRows, primalResidual, dPrimalFeasibility);

#else

  // cupdlp_copy(primalResidual, ax, cupdlp_float, lp->nRows);
  CUPDLP_COPY_VEC(primalResidual, ax, cupdlp_float, lp->nRows);

  // AddToVector(primalResidual, -1.0, problem->rhs, lp->nRows);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(work, lp->nRows, &alpha, problem->rhs, primalResidual);

  //  double dPrimalFeas = 0.0; // Redundant

  // todo, check
  //  cupdlp_projNegative(primalResidual + problem->nEqs, primalResidual +
  //  problem->nEqs, lp->nRows - problem->nEqs);
  //

  cupdlp_projNeg(primalResidual + problem->nEqs, lp->nRows - problem->nEqs);

  if (scaling->ifScaled) {
    // cupdlp_edot(primalResidual, scaling->rowScale, lp->nRows);
    // cupdlp_edot(primalResidual, scaling->rowScale_gpu, lp->nRows);

    // cupdlp_copy_vec(work->buffer3, scaling->rowScale, cupdlp_float,
    // lp->nRows); cupdlp_edot(primalResidual, work->buffer3, lp->nRows);

    cupdlp_edot(primalResidual, work->rowScale, lp->nRows);
  }

  if (work->settings->iInfNormAbsLocalTermination) {
    cupdlp_int index;
    cupdlp_infNormIndex(work, lp->nRows, primalResidual, &index);
    *dPrimalFeasibility = fabs(primalResidual[index]);

// WIP only allow native for the moment
// #ifdef CUPDLP_CPU
//     *dPrimalFeasibility = fabs(primalResidual[index]);
// #else
//     double res_value = get_fabs_value(primalResidual, index, lp->nRows);
//     *dPrimalFeasibility = fabs(res_value);   
// #endif

  } else {
    cupdlp_twoNorm(work, lp->nRows, primalResidual, dPrimalFeasibility);
  }

#endif
}